

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

int Pdr_SetIsInit(Pdr_Set_t *pCube,int iRemove)

{
  int iVar1;
  int local_20;
  int i;
  int iRemove_local;
  Pdr_Set_t *pCube_local;
  
  local_20 = 0;
  while( true ) {
    if (pCube->nLits <= local_20) {
      return 1;
    }
    if (*(int *)(&pCube->field_0x14 + (long)local_20 * 4) == -1) break;
    if ((local_20 != iRemove) &&
       (iVar1 = lit_sign(*(lit *)(&pCube->field_0x14 + (long)local_20 * 4)), iVar1 == 0)) {
      return 0;
    }
    local_20 = local_20 + 1;
  }
  __assert_fail("pCube->Lits[i] != -1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                ,0x182,"int Pdr_SetIsInit(Pdr_Set_t *, int)");
}

Assistant:

int Pdr_SetIsInit( Pdr_Set_t * pCube, int iRemove )
{
    int i;
    for ( i = 0; i < pCube->nLits; i++ )
    {
        assert( pCube->Lits[i] != -1 );
        if ( i == iRemove )
            continue;
        if ( lit_sign( pCube->Lits[i] ) == 0 )
            return 0;
    }
    return 1;
}